

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O1

string * __thiscall
ritobin::io::write_binary_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *bin,vector<char,_std::allocator<char>_> *out
          ,BinCompat *compat)

{
  bool bVar1;
  BinBinaryWriter local_38;
  
  local_38.error.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.error.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.error.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.writer.buffer_ = (vector<char,_std::allocator<char>_> *)bin;
  local_38.writer.compat_ = (BinCompat *)out;
  bVar1 = impl_binary_write::BinBinaryWriter::process(&local_38,(Bin *)this);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    impl_binary_write::BinBinaryWriter::trace_error_abi_cxx11_(__return_storage_ptr__,&local_38);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.error);
  return __return_storage_ptr__;
}

Assistant:

std::string write_binary(Bin const& bin, std::vector<char>& out, BinCompat const* compat) noexcept {
        BinBinaryWriter writer = { { out, compat }, {} };
        if (!writer.process(bin)) {
            return writer.trace_error();
        }
        return {};
    }